

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O2

ColorTracker * __thiscall ColorTracker::getCaptureImage(ColorTracker *this)

{
  char cVar1;
  ostream *poVar2;
  CameraException *pCVar3;
  long in_RSI;
  allocator local_162;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cv::Mat::Mat((Mat *)this);
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"failed to open camera");
    std::endl<char,std::char_traits<char>>(poVar2);
    pCVar3 = (CameraException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
               ,&local_161);
    std::operator+(&local_e0,"in ",&local_100);
    std::operator+(&local_c0,&local_e0,", at Line ");
    std::__cxx11::to_string(&local_120,0x59);
    std::operator+(&local_a0,&local_c0,&local_120);
    std::operator+(&local_80,&local_a0,", ");
    std::__cxx11::string::string((string *)&local_140,"getCaptureImage",&local_162);
    std::operator+(&local_60,&local_80,&local_140);
    std::operator+(&local_40,&local_60,"(): ");
    std::operator+(&local_160,&local_40,"failed to open camera");
    CameraException::CameraException(pCVar3,&local_160);
    __cxa_throw(pCVar3,&CameraException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_160.field_2._M_allocated_capacity = 0;
  local_160._M_dataplus._M_p._0_4_ = 0x2010000;
  local_160._M_string_length = (size_type)this;
  cVar1 = cv::VideoCapture::read((_OutputArray *)(in_RSI + 8));
  if (cVar1 != '\0') {
    return this;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"failed to get frame");
  std::endl<char,std::char_traits<char>>(poVar2);
  pCVar3 = (CameraException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_161);
  std::operator+(&local_e0,"in ",&local_100);
  std::operator+(&local_c0,&local_e0,", at Line ");
  std::__cxx11::to_string(&local_120,0x5e);
  std::operator+(&local_a0,&local_c0,&local_120);
  std::operator+(&local_80,&local_a0,", ");
  std::__cxx11::string::string((string *)&local_140,"getCaptureImage",&local_162);
  std::operator+(&local_60,&local_80,&local_140);
  std::operator+(&local_40,&local_60,"(): ");
  std::operator+(&local_160,&local_40,"failed to get frame");
  CameraException::CameraException(pCVar3,&local_160);
  __cxa_throw(pCVar3,&CameraException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Mat ColorTracker::getCaptureImage() noexcept(false){
    Mat img;
    if(!this->cap.isOpened()){
        cout << "failed to open camera" << endl;
		throw CameraException(WHERE + "failed to open camera");
    } else {
        bool ret = this->cap.read(img);
        if(!ret){
            cout << "failed to get frame" << endl;
		    throw CameraException(WHERE + "failed to get frame");
        }
    }
    return img;

}